

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

int fct_clp__is_param(fct_clp_t *clp,char *param)

{
  fct_clp_t *pfVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  char cVar5;
  long lVar6;
  
  uVar3 = 0;
  if ((clp != (fct_clp_t *)0x0) && (::clp.param_list.used_itm_num != 0)) {
    sVar4 = 0;
    do {
      pfVar1 = (fct_clp_t *)::clp.param_list.itm_list[sVar4];
      if (pfVar1 == clp) break;
      if ((pfVar1 != (fct_clp_t *)0x0) &&
         (cVar5 = *(char *)&(pfVar1->clo_list).itm_list, cVar5 == *(char *)&(clp->clo_list).itm_list
         )) {
        lVar6 = 1;
        do {
          if (cVar5 == '\0') {
            return 1;
          }
          cVar5 = pfVar1->error_msg[lVar6 + -0x30];
          lVar2 = lVar6 + -0x30;
          lVar6 = lVar6 + 1;
        } while (cVar5 == clp->error_msg[lVar2]);
      }
      sVar4 = sVar4 + 1;
    } while (sVar4 != ::clp.param_list.used_itm_num);
    uVar3 = (uint)(pfVar1 == clp);
  }
  return uVar3;
}

Assistant:

static int
fct_clp__is_param(fct_clp_t *clp, char const *param)
{
    if ( clp == NULL || param == NULL )
    {
        return 0;
    }
    FCT_NLIST_FOREACH_BGN(char *, aparam, &(clp->param_list))
    {
        if ( fctstr_eq(aparam, param) )
        {
            return 1;
        }
    }
    FCT_NLIST_FOREACH_END();
    return 0;
}